

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O3

void __thiscall deqp::egl::Image::ImageTargetGLES2::~ImageTargetGLES2(ImageTargetGLES2 *this)

{
  glu::CallLogWrapper::~CallLogWrapper(&(this->super_ImageTestCase).super_CallLogWrapper);
  TestCase::~TestCase((TestCase *)this);
  operator_delete(this,0x1ad0);
  return;
}

Assistant:

static const char* getTargetName (GLenum target)
	{
		switch (target)
		{
			case GL_TEXTURE_2D:		return "tex2d";
			case GL_RENDERBUFFER:	return "renderbuffer";
			default:
				DE_ASSERT(DE_FALSE);
				return "";
		}
	}